

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatin1stringmatcher.cpp
# Opt level: O0

qsizetype __thiscall
QLatin1StringMatcher::indexIn_helper<QLatin1StringView>
          (QLatin1StringMatcher *this,QLatin1StringView haystack,qsizetype from)

{
  longlong lVar1;
  QLatin1StringView s;
  bool bVar2;
  char *pcVar3;
  qsizetype qVar4;
  const_iterator pat_last;
  longlong *plVar5;
  difference_type dVar6;
  char *in_RCX;
  const_iterator pvVar7;
  qsizetype in_RDX;
  char *in_RSI;
  QLatin1StringView *in_RDI;
  long in_FS_OFFSET;
  R_conflict10 RVar8;
  bool needleLongerThanBuffer;
  qsizetype bufferSize;
  const_iterator found;
  const_iterator end;
  const_iterator begin;
  const_iterator start;
  QLatin1StringView restHaystack;
  QLatin1StringView restNeedle;
  QLatin1StringView *in_stack_fffffffffffffeb8;
  QLatin1StringView *in_stack_fffffffffffffec0;
  qsizetype in_stack_fffffffffffffec8;
  longlong pos;
  QLatin1StringView *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  qsizetype in_stack_fffffffffffffee8;
  char *in_stack_ffffffffffffff00;
  q_boyer_moore_searcher_hashed_needle<const_char_*,_QtPrivate::QCaseSensitiveLatin1Hash,_std::equal_to<void>_>
  *this_00;
  R_conflict10 in_stack_ffffffffffffff10;
  const_iterator local_d0;
  char *local_a0;
  char *local_90;
  long local_78;
  qsizetype local_70;
  QLatin1StringView local_68;
  char *local_58;
  qsizetype local_50;
  QLatin1StringView local_48;
  longlong local_38;
  qsizetype local_30;
  char *local_28;
  qsizetype local_20;
  QLatin1StringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.m_data = in_RSI;
  local_18.m_size = in_RDX;
  bVar2 = QLatin1StringView::isEmpty((QLatin1StringView *)0x21d34e);
  if ((!bVar2) ||
     (in_stack_ffffffffffffff00 = in_RCX, pcVar3 = (char *)QLatin1StringView::size(&local_18),
     local_90 = in_RCX, in_stack_ffffffffffffff00 != pcVar3)) {
    local_a0 = in_RCX;
    if ((long)in_RCX < 0) {
      qVar4 = QLatin1StringView::size(&local_18);
      local_a0 = in_RCX + qVar4;
    }
    pcVar3 = local_a0;
    qVar4 = QLatin1StringView::size(&local_18);
    if ((long)pcVar3 < qVar4) {
      local_28 = local_18.m_data;
      local_20 = local_18.m_size;
      pat_last = indexIn_helper<QLatin1StringView>::anon_class_16_1_fba7f966::operator()
                           ((anon_class_16_1_fba7f966 *)0x21d41d);
      local_a0 = pat_last + (long)local_a0;
      qVar4 = QLatin1StringView::size(&local_18);
      this_00 = (q_boyer_moore_searcher_hashed_needle<const_char_*,_QtPrivate::QCaseSensitiveLatin1Hash,_std::equal_to<void>_>
                 *)in_stack_ffffffffffffff10.begin;
      pvVar7 = pat_last + qVar4;
      if (*(int *)&in_RDI[1].m_data == 1) {
        in_stack_fffffffffffffed0 = in_RDI + 2;
        QLatin1StringView::begin((QLatin1StringView *)0x21d4b9);
        QLatin1StringView::end(in_stack_fffffffffffffec0);
        RVar8 = QtPrivate::
                q_boyer_moore_searcher_hashed_needle<char_const*,QtPrivate::QCaseSensitiveLatin1Hash,std::equal_to<void>>
                ::operator()(this_00,(char *)in_RDI,in_stack_ffffffffffffff00,pcVar3,pat_last);
        local_d0 = RVar8.begin;
        if (local_d0 == pvVar7) {
          local_90 = (char *)0xffffffffffffffff;
          goto LAB_0021d797;
        }
      }
      else {
        local_30 = QLatin1StringView::size(in_RDI);
        local_38 = 0x100;
        plVar5 = std::min<long_long>(&local_30,&local_38);
        lVar1 = *plVar5;
        local_48.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_48.m_data = &DAT_aaaaaaaaaaaaaaaa;
        local_48 = QLatin1StringView::sliced(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        qVar4 = QLatin1StringView::size(&local_48);
        local_58 = local_18.m_data;
        local_50 = local_18.m_size;
        do {
          in_stack_ffffffffffffff10 =
               QtPrivate::
               q_boyer_moore_searcher_hashed_needle<char_const*,QtPrivate::QCaseInsensitiveLatin1Hash,std::equal_to<void>>
               ::operator()((q_boyer_moore_searcher_hashed_needle<const_char_*,_QtPrivate::QCaseInsensitiveLatin1Hash,_std::equal_to<void>_>
                             *)in_stack_ffffffffffffff10.begin,(char *)in_RDI,
                            in_stack_ffffffffffffff00,pcVar3,pat_last);
          if (in_stack_ffffffffffffff10.begin == pvVar7) {
            local_90 = (char *)0xffffffffffffffff;
            goto LAB_0021d797;
          }
          local_a0 = in_stack_fffffffffffffed8;
          if (qVar4 < 1) break;
          local_70 = QLatin1StringView::size(&local_18);
          pos = lVar1;
          dVar6 = std::distance<char_const*>
                            (in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0);
          local_78 = pos + dVar6;
          qMin<long_long>(&local_70,&local_78);
          local_68 = QLatin1StringView::sliced(in_stack_fffffffffffffed0,pos);
          local_58 = local_68.m_data;
          local_50 = local_68.m_size;
          s.m_size = in_stack_fffffffffffffee8;
          s.m_data = in_stack_fffffffffffffee0;
          bVar2 = QLatin1StringView::startsWith(in_stack_fffffffffffffeb8,s,CaseInsensitive);
          local_a0 = in_stack_fffffffffffffed8;
        } while (!bVar2);
      }
      local_90 = (char *)std::distance<char_const*>(local_a0,(char *)in_stack_fffffffffffffed0);
    }
    else {
      local_90 = (char *)0xffffffffffffffff;
    }
  }
LAB_0021d797:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (qsizetype)local_90;
  }
  __stack_chk_fail();
}

Assistant:

qsizetype QLatin1StringMatcher::indexIn_helper(String haystack, qsizetype from) const noexcept
{
    static_assert(QtPrivate::isLatin1OrUtf16View<String>);

    if (m_pattern.isEmpty() && from == haystack.size())
        return from;
    if (from < 0) // Historical behavior (see QString::indexOf and co.)
        from += haystack.size();
    if (from >= haystack.size())
        return -1;

    const auto start = [haystack] {
        if constexpr (std::is_same_v<String, QStringView>)
            return haystack.utf16();
        else
            return haystack.begin();
    }();

    auto begin = start + from;
    auto end = start + haystack.size();
    auto found = begin;
    if (m_cs == Qt::CaseSensitive) {
        found = m_caseSensitiveSearcher(begin, end, m_pattern.begin(), m_pattern.end()).begin;
        if (found == end)
            return -1;
    } else {
        const qsizetype bufferSize = std::min(m_pattern.size(), qsizetype(sizeof m_foldBuffer));
        const QLatin1StringView restNeedle = m_pattern.sliced(bufferSize);
        const bool needleLongerThanBuffer = restNeedle.size() > 0;
        String restHaystack = haystack;
        do {
            found = m_caseInsensitiveSearcher(found, end, m_foldBuffer, &m_foldBuffer[bufferSize])
                            .begin;
            if (found == end) {
                return -1;
            } else if (!needleLongerThanBuffer) {
                break;
            }
            restHaystack = haystack.sliced(
                    qMin(haystack.size(),
                         bufferSize + qsizetype(std::distance(start, found))));
            if (restHaystack.startsWith(restNeedle, Qt::CaseInsensitive))
                break;
            ++found;
        } while (true);
    }
    return std::distance(start, found);
}